

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameParseCleanup(Parse *pParse)

{
  RenameToken *in_RDI;
  sqlite3 *unaff_retaddr;
  sqlite3 *db;
  Table *in_stack_ffffffffffffffe8;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)in_RDI->p;
  if (*(long *)&(in_RDI->t).n != 0) {
    sqlite3VdbeFinalize((Vdbe *)db_00);
  }
  sqlite3DeleteTable(db_00,in_stack_ffffffffffffffe8);
  if (in_RDI[10].p != (void *)0x0) {
    sqlite3FreeIndex(db_00,(Index *)in_stack_ffffffffffffffe8);
  }
  sqlite3DeleteTrigger(db_00,(Trigger *)in_stack_ffffffffffffffe8);
  sqlite3DbFree(db_00,in_stack_ffffffffffffffe8);
  renameTokenFree(unaff_retaddr,in_RDI);
  sqlite3ParserReset((Parse *)db_00);
  return;
}

Assistant:

static void renameParseCleanup(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( pParse->pVdbe ){
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db, pParse->pNewTable);
  if( pParse->pNewIndex ) sqlite3FreeIndex(db, pParse->pNewIndex);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->zErrMsg);
  renameTokenFree(db, pParse->pRename);
  sqlite3ParserReset(pParse);
}